

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

GRULayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::GRULayerParams>(Arena *arena)

{
  GRULayerParams *pGVar1;
  
  if (arena != (Arena *)0x0) {
    pGVar1 = DoCreateMessage<CoreML::Specification::GRULayerParams>(arena);
    return pGVar1;
  }
  pGVar1 = (GRULayerParams *)operator_new(0x88);
  CoreML::Specification::GRULayerParams::GRULayerParams(pGVar1,(Arena *)0x0,false);
  return pGVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }